

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O0

void non_empty_closedir_cb(uv_fs_t *req)

{
  uv_fs_t *req_local;
  
  if (req != &closedir_req) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
            ,0x114,"req == &closedir_req");
    abort();
  }
  if (closedir_req.result != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
            ,0x115,"req->result == 0");
    abort();
  }
  uv_fs_req_cleanup(&closedir_req);
  non_empty_closedir_cb_count = non_empty_closedir_cb_count + 1;
  return;
}

Assistant:

static void non_empty_closedir_cb(uv_fs_t* req) {
  ASSERT(req == &closedir_req);
  ASSERT(req->result == 0);
  uv_fs_req_cleanup(req);
  ++non_empty_closedir_cb_count;
}